

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void free_pool(j_common_ptr cinfo,int pool_id)

{
  jpeg_memory_mgr *pjVar1;
  large_pool_ptr plVar2;
  size_t sizeofobject;
  size_t sVar3;
  small_pool_ptr_conflict next_shdr_ptr;
  large_pool_ptr_conflict next_lhdr_ptr;
  jvirt_barray_ptr bptr;
  jvirt_sarray_ptr sptr;
  size_t space_freed;
  large_pool_ptr_conflict lhdr_ptr;
  small_pool_ptr_conflict shdr_ptr;
  my_mem_ptr mem;
  int pool_id_local;
  j_common_ptr cinfo_local;
  
  pjVar1 = cinfo->mem;
  if ((pool_id < 0) || (1 < pool_id)) {
    cinfo->err->msg_code = 0xf;
    (cinfo->err->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  if (pool_id == 1) {
    for (bptr = (jvirt_barray_ptr)pjVar1[1].request_virt_sarray; bptr != (jvirt_barray_ptr)0x0;
        bptr = bptr->next) {
      if (bptr->b_s_open != 0) {
        bptr->b_s_open = 0;
        (*(bptr->b_s_info).close_backing_store)(cinfo,&bptr->b_s_info);
      }
    }
    pjVar1[1].request_virt_sarray =
         (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
    for (next_lhdr_ptr = (large_pool_ptr_conflict)pjVar1[1].request_virt_barray;
        next_lhdr_ptr != (large_pool_ptr_conflict)0x0; next_lhdr_ptr = next_lhdr_ptr[2].hdr.next) {
      if (*(int *)((long)next_lhdr_ptr + 0x2c) != 0) {
        *(undefined4 *)((long)next_lhdr_ptr + 0x2c) = 0;
        (*(code *)next_lhdr_ptr[3].dummy)(cinfo,(long)next_lhdr_ptr + 0x38);
      }
    }
    pjVar1[1].request_virt_barray =
         (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
  }
  space_freed = (size_t)(&pjVar1[1].alloc_sarray)[pool_id];
  (&pjVar1[1].alloc_sarray)[pool_id] =
       (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0;
  while (space_freed != 0) {
    sVar3 = *(size_t *)space_freed;
    sizeofobject = *(long *)(space_freed + 8) + *(long *)(space_freed + 0x10) + 0x18;
    jpeg_free_large(cinfo,(void *)space_freed,sizeofobject);
    pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + -sizeofobject;
    space_freed = sVar3;
  }
  lhdr_ptr = (large_pool_ptr_conflict)(&pjVar1[1].alloc_small)[pool_id];
  (&pjVar1[1].alloc_small)[pool_id] = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
  while (lhdr_ptr != (large_pool_ptr_conflict)0x0) {
    plVar2 = (lhdr_ptr->hdr).next;
    sVar3 = (lhdr_ptr->hdr).bytes_used + (lhdr_ptr->hdr).bytes_left + 0x18;
    jpeg_free_small(cinfo,lhdr_ptr,sVar3);
    pjVar1[1].realize_virt_arrays = pjVar1[1].realize_virt_arrays + -sVar3;
    lhdr_ptr = plVar2;
  }
  return;
}

Assistant:

METHODDEF(void)
free_pool (j_common_ptr cinfo, int pool_id)
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  small_pool_ptr shdr_ptr;
  large_pool_ptr lhdr_ptr;
  size_t space_freed;

  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

#ifdef MEM_STATS
  if (cinfo->err->trace_level > 1)
    print_mem_stats(cinfo, pool_id); /* print pool's memory usage statistics */
#endif

  /* If freeing IMAGE pool, close any virtual arrays first */
  if (pool_id == JPOOL_IMAGE) {
    jvirt_sarray_ptr sptr;
    jvirt_barray_ptr bptr;

    for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
      if (sptr->b_s_open) {	/* there may be no backing store */
	sptr->b_s_open = FALSE;	/* prevent recursive close if error */
	(*sptr->b_s_info.close_backing_store) (cinfo, & sptr->b_s_info);
      }
    }
    mem->virt_sarray_list = NULL;
    for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
      if (bptr->b_s_open) {	/* there may be no backing store */
	bptr->b_s_open = FALSE;	/* prevent recursive close if error */
	(*bptr->b_s_info.close_backing_store) (cinfo, & bptr->b_s_info);
      }
    }
    mem->virt_barray_list = NULL;
  }

  /* Release large objects */
  lhdr_ptr = mem->large_list[pool_id];
  mem->large_list[pool_id] = NULL;

  while (lhdr_ptr != NULL) {
    large_pool_ptr next_lhdr_ptr = lhdr_ptr->hdr.next;
    space_freed = lhdr_ptr->hdr.bytes_used +
		  lhdr_ptr->hdr.bytes_left +
		  SIZEOF(large_pool_hdr);
    jpeg_free_large(cinfo, (void FAR *) lhdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    lhdr_ptr = next_lhdr_ptr;
  }

  /* Release small objects */
  shdr_ptr = mem->small_list[pool_id];
  mem->small_list[pool_id] = NULL;

  while (shdr_ptr != NULL) {
    small_pool_ptr next_shdr_ptr = shdr_ptr->hdr.next;
    space_freed = shdr_ptr->hdr.bytes_used +
		  shdr_ptr->hdr.bytes_left +
		  SIZEOF(small_pool_hdr);
    jpeg_free_small(cinfo, (void *) shdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    shdr_ptr = next_shdr_ptr;
  }
}